

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true> __thiscall
duckdb::DuckTransactionManager::RemoveTransaction
          (DuckTransactionManager *this,DuckTransaction *transaction,bool store_transaction)

{
  transaction_t *this_00;
  atomic<unsigned_long> *this_01;
  UndoBuffer *this_02;
  const_iterator __first;
  ulong uVar1;
  bool bVar2;
  transaction_t tVar3;
  reference pvVar4;
  pointer pDVar5;
  DatabaseManager *pDVar6;
  pointer pDVar7;
  BufferManager *pBVar8;
  undefined4 in_ECX;
  transaction_t tVar9;
  DuckTransaction *pDVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  long lVar12;
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
  *this_03;
  idx_t i;
  ulong __n;
  ulong uVar13;
  ulong uVar14;
  idx_t t_idx;
  size_type sVar15;
  _Head_base<0UL,_duckdb::DuckTransaction_*,_false> local_60;
  DuckTransaction *local_58;
  ulong local_50;
  undefined4 local_44;
  size_type local_40;
  __int_type local_38;
  
  local_58 = (DuckTransaction *)CONCAT71(in_register_00000011,store_transaction);
  local_44 = in_ECX;
  make_uniq<duckdb::DuckCleanupInfo>();
  this_00 = &transaction->transaction_id;
  tVar9 = transaction->transaction_id;
  tVar3 = transaction->commit_id;
  local_40 = (long)(tVar3 - tVar9) >> 3;
  uVar13 = 0x4000000000000060;
  local_50 = 0xffffffffffffffff;
  uVar14 = 0xffffffffffffffff;
  for (__n = 0; sVar15 = local_40, __n < (ulong)((long)(tVar3 - tVar9) >> 3); __n = __n + 1) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_00,__n);
    uVar11 = uVar14;
    uVar1 = __n;
    if ((pvVar4->
        super_unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::DuckTransaction_*,_std::default_delete<duckdb::DuckTransaction>_>
        .super__Head_base<0UL,_duckdb::DuckTransaction_*,_false>._M_head_impl != local_58) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                            *)this_00,__n);
      pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar4);
      uVar11 = pDVar5->start_time;
      if (uVar13 < pDVar5->start_time) {
        uVar11 = uVar13;
      }
      uVar13 = uVar11;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                            *)this_00,__n);
      pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar4);
      uVar11 = pDVar5->transaction_id;
      if (uVar14 < pDVar5->transaction_id) {
        uVar11 = uVar14;
      }
      pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                            *)this_00,__n);
      pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar4);
      uVar14 = (pDVar5->super_Transaction).active_query.super___atomic_base<unsigned_long>._M_i;
      uVar1 = local_40;
      if (uVar14 <= local_50) {
        local_50 = uVar14;
      }
    }
    local_40 = uVar1;
    tVar9 = transaction->transaction_id;
    tVar3 = transaction->commit_id;
    uVar14 = uVar11;
  }
  LOCK();
  *(ulong *)&(transaction->super_Transaction).is_read_only = uVar13;
  UNLOCK();
  LOCK();
  (transaction->super_Transaction).active_query.super___atomic_base<unsigned_long>._M_i = uVar14;
  UNLOCK();
  pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                        *)this_00,local_40);
  local_60._M_head_impl =
       (pvVar4->
       super_unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DuckTransaction_*,_std::default_delete<duckdb::DuckTransaction>_>
       .super__Head_base<0UL,_duckdb::DuckTransaction_*,_false>._M_head_impl;
  (pvVar4->super_unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DuckTransaction_*,_std::default_delete<duckdb::DuckTransaction>_>.
  super__Head_base<0UL,_duckdb::DuckTransaction_*,_false>._M_head_impl = (DuckTransaction *)0x0;
  pDVar6 = DatabaseManager::Get((AttachedDatabase *)(transaction->super_Transaction).manager);
  local_38 = (pDVar6->current_query_number).super___atomic_base<unsigned_long>._M_i;
  if ((char)local_44 == '\0') {
    bVar2 = DuckTransaction::ChangesMade(local_58);
    if (!bVar2) goto LAB_015a3631;
    pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                           *)&local_60);
    pDVar5->awaiting_cleanup = true;
    pDVar7 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
             ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                           *)this);
    this_03 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
               *)&pDVar7->transactions;
  }
  else if (local_58->commit_id == 0) {
    pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                           *)&local_60);
    pDVar5->highest_active_query = local_38;
    this_03 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
               *)&transaction->undo_buffer;
  }
  else {
    this_03 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
               *)&transaction->catalog_version;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
            (this_03,(unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                      *)&local_60);
LAB_015a3631:
  pDVar7 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>::
           operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                       *)this);
  pDVar7->lowest_start_time = uVar13;
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
  ::unsafe_erase_at((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                     *)this_00,sVar15);
  this_01 = &transaction->catalog_version;
  this_02 = &transaction->undo_buffer;
  lVar12 = 0;
  for (uVar14 = 0;
      uVar14 < (ulong)((long)(*(long *)&transaction->awaiting_cleanup -
                             (transaction->catalog_version).super___atomic_base<unsigned_long>._M_i)
                      >> 3); uVar14 = uVar14 + 1) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_01,uVar14);
    unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>::
    operator->(pvVar4);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_01,uVar14);
    pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->(pvVar4);
    if (uVar13 <= pDVar5->commit_id) break;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_01,uVar14);
    pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->(pvVar4);
    pDVar5->awaiting_cleanup = true;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_01,uVar14);
    pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->(pvVar4);
    pDVar5->highest_active_query = local_38;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_01,uVar14);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                *)this_02,pvVar4);
    lVar12 = lVar12 + -8;
  }
  if (uVar14 != 0) {
    __first._M_current =
         (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true> *)
         (this_01->super___atomic_base<unsigned_long>)._M_i;
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
    ::erase((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
             *)this_01,__first,
            (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             *)((long)__first._M_current - lVar12));
  }
  pBVar8 = (transaction->undo_buffer).allocator.buffer_manager;
  pDVar10 = (transaction->undo_buffer).transaction;
  uVar13 = 0;
  if (transaction->transaction_id == transaction->commit_id) {
    uVar13 = (long)pBVar8 - (long)pDVar10 >> 3;
  }
  lVar12 = uVar13 * -8;
  for (; uVar13 < (ulong)((long)pBVar8 - (long)pDVar10 >> 3); uVar13 = uVar13 + 1) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                          *)this_02,uVar13);
    pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->(pvVar4);
    if (local_50 <= pDVar5->highest_active_query) break;
    pDVar10 = (transaction->undo_buffer).transaction;
    pBVar8 = (transaction->undo_buffer).allocator.buffer_manager;
    lVar12 = lVar12 + -8;
  }
  if (uVar13 != 0) {
    for (sVar15 = 0; uVar13 != sVar15; sVar15 = sVar15 + 1) {
      pDVar7 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
               ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                             *)this);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                            *)this_02,sVar15);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
                ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                  *)&pDVar7->transactions,pvVar4);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
    ::erase((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
             *)this_02,
            (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             *)this_02->transaction,
            (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             *)((long)this_02->transaction - lVar12));
  }
  if (local_60._M_head_impl != (DuckTransaction *)0x0) {
    (*((local_60._M_head_impl)->super_Transaction)._vptr_Transaction[1])();
  }
  return (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)
         (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)this;
}

Assistant:

unique_ptr<DuckCleanupInfo> DuckTransactionManager::RemoveTransaction(DuckTransaction &transaction,
                                                                      bool store_transaction) noexcept {
	auto cleanup_info = make_uniq<DuckCleanupInfo>();

	// Find the transaction in the active transactions,
	// as well as the lowest start time, transaction id, and active query.
	idx_t t_index = active_transactions.size();
	auto lowest_start_time = TRANSACTION_ID_START;
	auto lowest_transaction_id = MAX_TRANSACTION_ID;
	auto lowest_active_query = MAXIMUM_QUERY_ID;
	for (idx_t i = 0; i < active_transactions.size(); i++) {
		if (active_transactions[i].get() == &transaction) {
			t_index = i;
			continue;
		}
		lowest_start_time = MinValue(lowest_start_time, active_transactions[i]->start_time);
		lowest_transaction_id = MinValue(lowest_transaction_id, active_transactions[i]->transaction_id);
		transaction_t active_query = active_transactions[i]->active_query;
		lowest_active_query = MinValue(lowest_active_query, active_query);
	}
	lowest_active_start = lowest_start_time;
	lowest_active_id = lowest_transaction_id;
	auto lowest_stored_query = lowest_start_time;
	D_ASSERT(t_index != active_transactions.size());

	// Decide if we need to store the transaction, or if we can schedule it for cleanup.
	auto current_transaction = std::move(active_transactions[t_index]);
	auto current_query = DatabaseManager::Get(db).ActiveQueryNumber();
	if (store_transaction) {
		// If the transaction made any changes, we need to keep it around.
		if (transaction.commit_id != 0) {
			// The transaction was committed.
			// We add it to the list of recently committed transactions.
			recently_committed_transactions.push_back(std::move(current_transaction));
		} else {
			// The transaction was aborted.
			// We might still need its information; add it to the set of transactions awaiting GC.
			current_transaction->highest_active_query = current_query;
			old_transactions.push_back(std::move(current_transaction));
		}
	} else if (transaction.ChangesMade()) {
		// We do not need to store the transaction, directly schedule it for cleanup.
		current_transaction->awaiting_cleanup = true;
		cleanup_info->transactions.push_back(std::move(current_transaction));
	}
	cleanup_info->lowest_start_time = lowest_start_time;

	// Remove the transaction from the list of active transactions.
	active_transactions.unsafe_erase_at(t_index);

	// Traverse the recently_committed transactions to see if we can move any
	// to the list of transactions awaiting GC.
	idx_t i = 0;
	for (; i < recently_committed_transactions.size(); i++) {
		D_ASSERT(recently_committed_transactions[i]);
		lowest_stored_query = MinValue(recently_committed_transactions[i]->start_time, lowest_stored_query);
		if (recently_committed_transactions[i]->commit_id >= lowest_start_time) {
			// recently_committed_transactions is ordered on commit_id.
			// Thus, if the current commit_id is greater than
			// lowest_start_time, any subsequent commit IDs are also greater.
			break;
		}

		// Changes made BEFORE this transaction are no longer relevant.
		// We can schedule the transaction and its undo buffer for cleanup.
		recently_committed_transactions[i]->awaiting_cleanup = true;

		// HOWEVER: Any currently running QUERY can still be using
		// the version information of the transaction.
		// If we remove the UndoBuffer immediately, we have a race condition.

		// Store the current highest active query.
		recently_committed_transactions[i]->highest_active_query = current_query;
		// Move it to the list of transactions awaiting GC.
		old_transactions.push_back(std::move(recently_committed_transactions[i]));
	}

	if (i > 0) {
		// We moved these transactions to the list of transactions awaiting GC.
		auto start = recently_committed_transactions.begin();
		auto end = recently_committed_transactions.begin() + static_cast<int64_t>(i);
		recently_committed_transactions.erase(start, end);
	}

	// Check if we can clean up and free the memory of any old transactions.
	i = active_transactions.empty() ? old_transactions.size() : 0;
	for (; i < old_transactions.size(); i++) {
		D_ASSERT(old_transactions[i]);
		D_ASSERT(old_transactions[i]->highest_active_query > 0);
		if (old_transactions[i]->highest_active_query >= lowest_active_query) {
			// There is still a query running that could be using
			// this transactions' data.
			break;
		}
	}

	if (i > 0) {
		// We garbage-collected old transactions:
		// - Remove them from the list and schedule them for cleanup.

		// We can only safely do the actual memory cleanup when all the
		// currently active queries have finished running! (actually,
		// when all the currently active scans have finished running...).

		// Because we clean up asynchronously, we only clean up once we
		// no longer need the transaction for anything (i.e., we can move it).
		for (idx_t t_idx = 0; t_idx < i; t_idx++) {
			cleanup_info->transactions.push_back(std::move(old_transactions[t_idx]));
		}
		old_transactions.erase(old_transactions.begin(), old_transactions.begin() + static_cast<int64_t>(i));
	}

	return cleanup_info;
}